

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O2

void __thiscall AbstractTestExample::PrintDataInformation(AbstractTestExample *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  size_type __n;
  double dVar9;
  double local_48;
  double local_40;
  
  local_40 = 0.0;
  iVar6 = 1;
  local_48 = 0.0;
  iVar7 = 0;
  iVar8 = 0;
  for (__n = 0; (long)__n < (long)this->trainN; __n = __n + 1) {
    pvVar4 = std::
             vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
             ::at((this->trainData).
                  super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,__n);
    lVar3 = std::cout;
    dVar9 = (((pvVar4->
              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish[-1];
    iVar7 = iVar7 + (uint)(dVar9 != 1.0);
    iVar8 = iVar8 + (uint)(dVar9 == 1.0);
    if (__n == (this->trainIndexEachUpdate).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar6] - 1) {
      dVar9 = (double)iVar7 / (double)iVar8;
      local_48 = local_48 + dVar9;
      local_40 = local_40 + dVar9 * dVar9;
      iVar1 = this->trainN;
      iVar6 = iVar6 + 1;
      *(undefined8 *)(std::operator>> + *(long *)(std::cout + -0x18)) = 4;
      lVar2 = *(long *)(lVar3 + -0x18);
      *(uint *)(strcmp + lVar2) = *(uint *)(strcmp + lVar2) & 0xfffffefb | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) = 2;
      poVar5 = std::ostream::_M_insert<double>((double)(int)__n / (double)iVar1);
      poVar5 = std::operator<<(poVar5,"   ");
      lVar3 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x10) = 4;
      *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar5 + *(long *)(lVar3 + -0x18) + 8) = 2;
      poVar5 = std::ostream::_M_insert<double>(dVar9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  local_48 = local_48 / (double)(iVar6 + -1);
  dVar9 = local_40 / (double)(iVar6 + -1) - local_48 * local_48;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  std::operator<<((ostream *)&std::cout,"meanImbalance ");
  poVar5 = std::ostream::_M_insert<double>(local_48);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"std ");
  poVar5 = std::ostream::_M_insert<double>(dVar9);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"normalizedStd ");
  poVar5 = std::ostream::_M_insert<double>(dVar9 / local_48);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void AbstractTestExample::PrintDataInformation()
{
    // print imbalance ratio after one data chunk arrives
    int posN=0;
    int negN=0;
    double imbalanceRatio=0;
    double sum=0;
    double sumsq=0;
    int steps=1;
    for(int i=0; i<trainN;i++)
    {
        double tempL=trainData->at(i)->back();
        if(tempL==1.0)posN++;
        else negN++;
        
        if(i==trainIndexEachUpdate[steps]-1)
        {
            imbalanceRatio=static_cast<double>(negN)/posN;
            sum+=imbalanceRatio;
            sumsq+=imbalanceRatio*imbalanceRatio;
            steps++;
            double percent=static_cast<double>(i)/trainN;
            std::cout<<std::setw(4)<< std::fixed<< std::setprecision(2)<<percent<<"   "
                <<std::setw(4)<< std::fixed<< std::setprecision(2)<<imbalanceRatio<<std::endl;
        }
    }
    
    double meanImbalance=sum/(steps-1);
    double std=sqrt(sumsq/(steps-1)-meanImbalance*meanImbalance);
    double normalizedStd=std/meanImbalance;
    std::cout<<"meanImbalance "<<meanImbalance<< std::endl;
    std::cout<<"std "<<std<< std::endl;
    std::cout<<"normalizedStd "<<normalizedStd<< std::endl;
}